

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O2

bool __thiscall
Parameter<std::__cxx11::string>::internalSetData<std::__cxx11::string>
          (Parameter<std::__cxx11::string> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tmp;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  string local_28 [32];
  
  local_48 = local_38;
  local_40 = 0;
  local_38[0] = 0;
  std::__cxx11::string::string(local_28,(string *)data);
  std::__cxx11::string::_M_assign((string *)&local_48);
  std::__cxx11::string::~string(local_28);
  this[0x2a] = (Parameter<std::__cxx11::string>)0x0;
  std::__cxx11::string::_M_assign((string *)(this + 0x30));
  std::__cxx11::string::~string((string *)&local_48);
  return true;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }